

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_string.c
# Opt level: O3

void assert_print_string(char *expected,char *input)

{
  cJSON_bool cVar1;
  long in_FS_OFFSET;
  uchar printed [1024];
  printbuffer local_458;
  uchar local_418 [1032];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_458.depth = 0;
  local_458.buffer = local_418;
  local_458.length = 0x400;
  local_458.offset = 0;
  local_458.noalloc = 1;
  local_458.format = 0;
  local_458.hooks.allocate = global_hooks.allocate;
  local_458.hooks.deallocate = global_hooks.deallocate;
  local_458.hooks.reallocate = global_hooks.reallocate;
  cVar1 = print_string_ptr((uchar *)input,&local_458);
  if (cVar1 == 0) {
    UnityFail("Failed to print string.",0x25);
  }
  UnityAssertEqualString(expected,(char *)local_418,"The printed string isn\'t as expected.",0x26);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void assert_print_string(const char *expected, const char *input)
{
    unsigned char printed[1024];
    printbuffer buffer = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.buffer = printed;
    buffer.length = sizeof(printed);
    buffer.offset = 0;
    buffer.noalloc = true;
    buffer.hooks = global_hooks;

    TEST_ASSERT_TRUE_MESSAGE(print_string_ptr((const unsigned char*)input, &buffer), "Failed to print string.");
    TEST_ASSERT_EQUAL_STRING_MESSAGE(expected, printed, "The printed string isn't as expected.");
}